

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
fmt::v8::detail::
specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>_>
::on_sign(specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>_>
          *this,sign_t s)

{
  bool bVar1;
  sign_t in_ESI;
  specs_setter<char> *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  require_numeric_argument
            ((specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>_>
              *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  bVar1 = is_integral_type(*(type *)&in_RDI[3].specs_);
  if ((((bVar1) && (*(int *)&in_RDI[3].specs_ != 1)) && (*(int *)&in_RDI[3].specs_ != 3)) &&
     (*(int *)&in_RDI[3].specs_ != 8)) {
    dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>
    ::on_error((dynamic_specs_handler<fmt::v8::basic_format_parse_context<char,_fmt::v8::detail::error_handler>_>
                *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(char *)in_RDI);
  }
  specs_setter<char>::on_sign(in_RDI,in_ESI);
  return;
}

Assistant:

FMT_CONSTEXPR void on_sign(sign_t s) {
    require_numeric_argument();
    if (is_integral_type(arg_type_) && arg_type_ != type::int_type &&
        arg_type_ != type::long_long_type && arg_type_ != type::char_type) {
      this->on_error("format specifier requires signed argument");
    }
    Handler::on_sign(s);
  }